

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O0

shared_ptr<Form>
buildList(vector<std::shared_ptr<Form>,_std::allocator<std::shared_ptr<Form>_>_> *forms)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  vector<std::shared_ptr<Form>,_std::allocator<std::shared_ptr<Form>_>_> *in_RSI;
  element_type *in_RDI;
  shared_ptr<Form> sVar3;
  int in_stack_00000024;
  shared_ptr<Form> *in_stack_00000028;
  SymbolTable *in_stack_ffffffffffffffd8;
  
  bVar1 = std::vector<std::shared_ptr<Form>,_std::allocator<std::shared_ptr<Form>_>_>::empty(in_RSI)
  ;
  if (bVar1) {
    sVar3 = SymbolTable::getEmptyPair(in_stack_ffffffffffffffd8);
    _Var2 = sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    std::vector<std::shared_ptr<Form>,_std::allocator<std::shared_ptr<Form>_>_>::data
              ((vector<std::shared_ptr<Form>,_std::allocator<std::shared_ptr<Form>_>_> *)0x188198);
    std::vector<std::shared_ptr<Form>,_std::allocator<std::shared_ptr<Form>_>_>::size(in_RSI);
    sVar3 = buildList(in_stack_00000028,in_stack_00000024);
    _Var2 = sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Form>)sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> buildList(std::vector<std::shared_ptr<Form>>& forms) {
  if(forms.empty()) {
    return gSymbolTable.getEmptyPair();
  }
  return buildList(forms.data(), forms.size());
}